

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Config::useStream(Config *this,string *streamName)

{
  streambuf *psVar1;
  Stream SVar2;
  
  SVar2 = createStream(streamName);
  std::ios::rdbuf((streambuf *)(&this->m_os + *(long *)(*(long *)&this->m_os + -0x18)));
  if (((this->m_stream).isOwned == true) &&
     (psVar1 = (this->m_stream).streamBuf, psVar1 != (streambuf *)0x0)) {
    (**(code **)(*(long *)psVar1 + 8))();
  }
  (this->m_stream).streamBuf = SVar2.streamBuf;
  (this->m_stream).isOwned = SVar2.isOwned;
  return;
}

Assistant:

void useStream( const std::string& streamName ) {
            Stream stream = createStream( streamName );
            setStreamBuf( stream.streamBuf );
            m_stream.release();
            m_stream = stream;
        }